

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O0

int Gia_ManCountMinterms(Gia_ManAre_t *p)

{
  int iVar1;
  int iVar2;
  uint *pStore;
  bool bVar3;
  int local_34;
  int Counter;
  int nMemSize;
  int i;
  uint *pMemory;
  Gia_StaAre_t *pCube;
  Gia_ManAre_t *p_local;
  
  local_34 = 0;
  iVar1 = Gia_ManRegNum(p->pAig);
  if (iVar1 < 0x1f) {
    iVar1 = Gia_ManRegNum(p->pAig);
    iVar1 = Abc_BitWordNum(1 << ((byte)iVar1 & 0x1f));
    pStore = (uint *)calloc((long)iVar1,4);
    Counter = 1;
    while( true ) {
      bVar3 = false;
      if (Counter < p->nStas) {
        pMemory = (uint *)Gia_ManAreStaInt(p,Counter);
        bVar3 = (Gia_StaAre_t *)pMemory != (Gia_StaAre_t *)0x0;
      }
      if (!bVar3) break;
      iVar2 = Gia_StaIsUsed((Gia_StaAre_t *)pMemory);
      if (iVar2 != 0) {
        iVar2 = Gia_ManRegNum(p->pAig);
        Gia_ManCountMintermsInCube((Gia_StaAre_t *)pMemory,iVar2,pStore);
      }
      Counter = Counter + 1;
    }
    for (Counter = 0; Counter < iVar1; Counter = Counter + 1) {
      iVar2 = Gia_WordCountOnes(pStore[Counter]);
      local_34 = iVar2 + local_34;
    }
    if (pStore != (uint *)0x0) {
      free(pStore);
    }
    p_local._4_4_ = local_34;
  }
  else {
    p_local._4_4_ = -1;
  }
  return p_local._4_4_;
}

Assistant:

int Gia_ManCountMinterms( Gia_ManAre_t * p )
{
    Gia_StaAre_t * pCube;
    unsigned * pMemory;
    int i, nMemSize, Counter = 0;
    if ( Gia_ManRegNum(p->pAig) > 30 )
        return -1;
    nMemSize = Abc_BitWordNum( 1 << Gia_ManRegNum(p->pAig) );
    pMemory  = ABC_CALLOC( unsigned, nMemSize );
    Gia_ManAreForEachCubeStore( p, pCube, i )
        if ( Gia_StaIsUsed(pCube) )
            Gia_ManCountMintermsInCube( pCube, Gia_ManRegNum(p->pAig), pMemory );
    for ( i = 0; i < nMemSize; i++ )
        Counter += Gia_WordCountOnes( pMemory[i] );
    ABC_FREE( pMemory );
    return Counter;
}